

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O0

void test_open_address_dictionary_handler_query_with_results(planck_unit_test_t *tc)

{
  ion_err_t iVar1;
  planck_unit_result_t pVar2;
  char cVar3;
  int iVar4;
  char *__s;
  ion_value_t str;
  ion_record_t record;
  undefined1 local_b0 [8];
  ion_predicate_t predicate;
  ion_dict_cursor_t *cursor;
  ion_dictionary_t test_dictionary;
  ion_dictionary_handler_t map_handler;
  ion_record_info_t record_info;
  int size;
  planck_unit_test_t *tc_local;
  
  map_handler.close_dictionary._4_4_ = 4;
  createTestDictionary
            ((ion_dictionary_handler_t *)&test_dictionary.handler,
             (ion_record_info_t *)((long)&map_handler.close_dictionary + 4),10,
             (ion_dictionary_t *)&cursor,key_type_numeric_signed);
  record.value._4_4_ = 1;
  dictionary_build_predicate
            ((ion_predicate_t *)local_b0,'\0',(undefined1 *)((long)&record.value + 4));
  iVar1 = dictionary_find((ion_dictionary_t *)&cursor,(ion_predicate_t *)local_b0,
                          (ion_dict_cursor_t **)&predicate.destroy);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 == '\0'),0xcd,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(*predicate.destroy == (_func_void_ion_predicate_t_ptr_ptr)0x2),0xd0,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  record.key = malloc(10);
  str = malloc((long)map_handler.close_dictionary._4_4_);
  cVar3 = (**(code **)(predicate.destroy + 0x18))(predicate.destroy,&str);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(cVar3 == '\x04'),0xd8,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  __s = (char *)malloc(10);
  sprintf(__s,"value : %i",(ulong)*(uint *)predicate._0_8_);
  iVar4 = memcmp(record.key,__s,10);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar4 == 0),0xe0,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  free(__s);
  cVar3 = (**(code **)(predicate.destroy + 0x18))(predicate.destroy,&str);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(cVar3 == '\x01'),0xe5,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  cVar3 = (**(code **)(predicate.destroy + 0x18))(predicate.destroy,&str);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(cVar3 == '\x01'),0xe8,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  free(record.key);
  free(str);
  (**(code **)(predicate.destroy + 0x20))(&predicate.destroy);
  dictionary_delete_dictionary((ion_dictionary_t *)&cursor);
  return;
}

Assistant:

void
test_open_address_dictionary_handler_query_with_results(
	planck_unit_test_t *tc
) {
	int					size;
	ion_record_info_t	record_info;

	/* this is required for initializing the hash map and should come from the dictionary */
	record_info.key_size	= sizeof(int);
	record_info.value_size	= 10;
	size					= 10;

	ion_dictionary_handler_t	map_handler;			/* create handler for hashmap */
	ion_dictionary_t			test_dictionary;		/* dictionary handler for test instance */

	createTestDictionary(&map_handler, &record_info, size, &test_dictionary, key_type_numeric_signed);

	ion_dict_cursor_t *cursor;	/* create a new cursor pointer */

	/* create a new predicate statement */
	ion_predicate_t predicate;

	dictionary_build_predicate(&predicate, predicate_equality, IONIZE(1, int));

	/* test that the query runs on dictionary instance okay */
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == dictionary_find(&test_dictionary, &predicate, &cursor));

	/* check the status of the cursor as it should be initialized */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_cursor_initialized == cursor->status);

	/* user must allocate memory before calling next() */
	ion_record_t record;

	record.value	= malloc(record_info.value_size);
	record.key		= malloc(record_info.key_size);

	PLANCK_UNIT_ASSERT_TRUE(tc, cs_cursor_active == cursor->next(cursor, &record));

	/* check that value is correct that has been returned */
	ion_value_t str;

	str = malloc(record_info.value_size);
	sprintf((char *) str, "value : %i", *(int *) predicate.statement.equality.equality_value);

	PLANCK_UNIT_ASSERT_TRUE(tc, ION_IS_EQUAL == memcmp(record.value, str, record_info.value_size));

	free(str);

	/* and as there is only 1 result, the next call should return empty */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_end_of_results == cursor->next(cursor, &record));

	/* and as there is only 1 result, the next call should return empty */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_end_of_results == cursor->next(cursor, &record));

	free(record.value);
	free(record.key);
	/* destory cursor for cleanup */
	cursor->destroy(&cursor);
	/* and destroy the dictionary instance */
	dictionary_delete_dictionary(&test_dictionary);
}